

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

char * str_sanitize_filename(char *aName)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  byte *pbVar7;
  ulong uVar8;
  
  pcVar5 = aName;
  pbVar7 = (byte *)aName;
  do {
    bVar2 = *pbVar7;
    uVar8 = (ulong)bVar2;
    if (uVar8 < 0x40) {
      if ((0xd400840400000000U >> (uVar8 & 0x3f) & 1) == 0) {
        if (uVar8 == 0) {
          pcVar6 = aName + -1;
          do {
            pcVar1 = pcVar6 + 1;
            pcVar6 = pcVar6 + 1;
          } while (*pcVar1 == ' ');
          do {
            bVar4 = true;
            for (; *pcVar6 == ' '; pcVar6 = pcVar6 + 1) {
              bVar4 = false;
            }
            if (*pcVar6 == '\0') {
              *aName = '\0';
              bVar4 = false;
            }
            else {
              if (!bVar4) {
                *aName = ' ';
                aName = aName + 1;
              }
              cVar3 = *pcVar6;
              pcVar6 = pcVar6 + 1;
              *aName = cVar3;
              aName = aName + 1;
              bVar4 = true;
            }
          } while (bVar4);
          return pcVar5;
        }
        goto LAB_00144fcf;
      }
LAB_00144fc2:
      *pbVar7 = 0x20;
    }
    else {
LAB_00144fcf:
      if ((bVar2 == 0x5c) || (bVar2 == 0x7c)) goto LAB_00144fc2;
    }
    pbVar7 = pbVar7 + 1;
  } while( true );
}

Assistant:

char* str_sanitize_filename(char* aName)
{
	char *str = (char *)aName;
	while(*str)
	{
		// replace forbidden characters with a whispace
		if(*str == '/' || *str == '<' || *str == '>' || *str == ':' || *str == '"'
			|| *str == '/' || *str == '\\' || *str == '|' || *str == '?' || *str == '*')
 			*str = ' ';
		str++;
	}
	str_clean_whitespaces(aName);
	return aName;
}